

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void tcpkeepalive(Curl_easy *data,curl_socket_t sockfd)

{
  uint uVar1;
  Curl_easy *pCVar2;
  int iVar3;
  uint *puVar4;
  uint local_18;
  uint local_14;
  int optval;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  local_18 = (uint)(((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ba >> 0x27) & 1) != 0);
  local_14 = sockfd;
  _optval = data;
  iVar3 = setsockopt(sockfd,1,9,&local_18,4);
  pCVar2 = _optval;
  uVar1 = local_14;
  if (iVar3 < 0) {
    if ((_optval != (Curl_easy *)0x0) && ((*(ulong *)&(_optval->set).field_0x8ba >> 0x1c & 1) != 0))
    {
      puVar4 = (uint *)__errno_location();
      Curl_infof(pCVar2,"Failed to set SO_KEEPALIVE on fd %d: errno %d",(ulong)uVar1,(ulong)*puVar4)
      ;
    }
  }
  else {
    local_18 = curlx_sltosi((long)(_optval->set).tcp_keepidle);
    iVar3 = setsockopt(local_14,6,4,&local_18,4);
    pCVar2 = _optval;
    uVar1 = local_14;
    if (((iVar3 < 0) && (_optval != (Curl_easy *)0x0)) &&
       ((*(ulong *)&(_optval->set).field_0x8ba >> 0x1c & 1) != 0)) {
      puVar4 = (uint *)__errno_location();
      Curl_infof(pCVar2,"Failed to set TCP_KEEPIDLE on fd %d: errno %d",(ulong)uVar1,(ulong)*puVar4)
      ;
    }
    local_18 = curlx_sltosi((long)(_optval->set).tcp_keepintvl);
    iVar3 = setsockopt(local_14,6,5,&local_18,4);
    pCVar2 = _optval;
    uVar1 = local_14;
    if (((iVar3 < 0) && (_optval != (Curl_easy *)0x0)) &&
       ((*(ulong *)&(_optval->set).field_0x8ba >> 0x1c & 1) != 0)) {
      puVar4 = (uint *)__errno_location();
      Curl_infof(pCVar2,"Failed to set TCP_KEEPINTVL on fd %d: errno %d",(ulong)uVar1,(ulong)*puVar4
                );
    }
  }
  return;
}

Assistant:

static void
tcpkeepalive(struct Curl_easy *data,
             curl_socket_t sockfd)
{
  int optval = data->set.tcp_keepalive?1:0;

  /* only set IDLE and INTVL if setting KEEPALIVE is successful */
  if(setsockopt(sockfd, SOL_SOCKET, SO_KEEPALIVE,
        (void *)&optval, sizeof(optval)) < 0) {
    infof(data, "Failed to set SO_KEEPALIVE on fd "
          "%" CURL_FORMAT_SOCKET_T ": errno %d",
          sockfd, SOCKERRNO);
  }
  else {
#if defined(SIO_KEEPALIVE_VALS)
    struct tcp_keepalive vals;
    DWORD dummy;
    vals.onoff = 1;
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    vals.keepalivetime = optval;
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    vals.keepaliveinterval = optval;
    if(WSAIoctl(sockfd, SIO_KEEPALIVE_VALS, (LPVOID) &vals, sizeof(vals),
                NULL, 0, &dummy, NULL, NULL) != 0) {
      infof(data, "Failed to set SIO_KEEPALIVE_VALS on fd "
                  "%" CURL_FORMAT_SOCKET_T ": errno %d",
                  sockfd, SOCKERRNO);
    }
#else
#ifdef TCP_KEEPIDLE
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPIDLE,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPIDLE on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#elif defined(TCP_KEEPALIVE)
    /* Mac OS X style */
    optval = curlx_sltosi(data->set.tcp_keepidle);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPALIVE,
      (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPALIVE on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#endif
#ifdef TCP_KEEPINTVL
    optval = curlx_sltosi(data->set.tcp_keepintvl);
    KEEPALIVE_FACTOR(optval);
    if(setsockopt(sockfd, IPPROTO_TCP, TCP_KEEPINTVL,
          (void *)&optval, sizeof(optval)) < 0) {
      infof(data, "Failed to set TCP_KEEPINTVL on fd "
            "%" CURL_FORMAT_SOCKET_T ": errno %d",
            sockfd, SOCKERRNO);
    }
#endif
#endif
  }
}